

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O1

LispPTR LCFetchMethod(LispPTR class,LispPTR selector)

{
  LispPTR *pLVar1;
  DLword *pDVar2;
  long lVar3;
  LispPTR LVar4;
  LispPTR LVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  LispPTR local_44;
  LispPTR local_3c;
  
  if (atom_instance == 0) {
    LCinit();
  }
  uVar8 = (ulong)(((selector ^ class) & 0x3ff) << 4);
  pLVar1 = (LispPTR *)((long)&LCMethodCache->class + uVar8);
  if ((*(LispPTR *)((long)&LCMethodCache->class + uVar8) == class) && (pLVar1[1] == selector)) {
    LVar5 = pLVar1[2];
  }
  else {
    uVar6 = *(ushort *)((ulong)(class >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if ((*(uint *)((long)DTDspace + (ulong)uVar6 * 4 + (ulong)(uVar6 << 5)) & 0xfffffff) ==
        atom_class) {
      if ((class & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)class);
      }
      local_44 = *(LispPTR *)(Lisp_world + (ulong)class + 0x10);
      LVar4 = class;
      do {
        if ((LVar4 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar4);
        }
        pDVar2 = Lisp_world;
        uVar8 = (ulong)*(uint *)(Lisp_world + (ulong)LVar4 + 0x16);
        if (uVar8 == 0) {
LAB_0012d744:
          LVar4 = car(local_44);
          if (LVar4 == 0) {
            iVar7 = 2;
            LVar4 = 0;
            LVar5 = local_3c;
          }
          else {
            local_44 = cdr(local_44);
            iVar7 = 0;
            LVar5 = 0;
          }
        }
        else {
          if ((*(uint *)(Lisp_world + (ulong)LVar4 + 0x16) & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar8);
          }
          lVar3 = 0;
          do {
            lVar9 = lVar3;
            LVar5 = *(LispPTR *)((long)Lisp_world + lVar9 + uVar8 * 2);
            if (LVar5 == 0) goto LAB_0012d744;
            lVar3 = lVar9 + 4;
          } while (LVar5 != selector);
          *pLVar1 = class;
          pLVar1[1] = selector;
          uVar6 = *(uint *)(pDVar2 + (ulong)LVar4 + 0x18);
          if ((uVar6 & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar6);
          }
          local_3c = *(LispPTR *)((long)Lisp_world + lVar9 + (ulong)uVar6 * 2);
          pLVar1[2] = local_3c;
          iVar7 = 1;
          LVar5 = local_3c;
        }
      } while (iVar7 == 0);
      if (iVar7 == 2) {
        LVar5 = 0;
      }
    }
    else {
      lcfuncall(atom_FetchMethod_LCUFN,2,3);
      LVar5 = 0xfffffffe;
    }
  }
  return LVar5;
}

Assistant:

LispPTR LCFetchMethod(LispPTR class, LispPTR selector) {
  struct LCMethodCacheEntry *ce;

  LC_INIT;

  /* Check cache before doing type check */
  ce = &(LCMethodCache[METH_CACHE_INDEX(class, selector)]);
  if (ce->class == class && ce->selector == selector) return ce->method_fn;

  /* it wasn't there, go search class then supers */

  if (!LC_TYPEP(class, atom_class)) RETCALL(atom_FetchMethod_LCUFN, 2);
  {
    LispPTR cur_class = class;
    LispPTR supers = ((struct LCClass *)NativeAligned4FromLAddr(cur_class))->supers;

    for (;;) {
      int i = 0;
      LispPTR val;
      struct LCClass *classptr;
      LispPTR *selectorptr;

      classptr = (struct LCClass *)NativeAligned4FromLAddr(cur_class);
      if (classptr->selectors == NIL_PTR)
        goto next_class;
      else
        selectorptr = (LispPTR *)NativeAligned4FromLAddr(classptr->selectors);

      while ((val = selectorptr[i++]) != NIL_PTR) {
        if (val == selector) {
          ce->class = class;
          ce->selector = selector;
          return (ce->method_fn = ((LispPTR *)NativeAligned4FromLAddr(classptr->methods))[i - 1]);
        }
      }

    next_class:
      if ((cur_class = car(supers)) == NIL_PTR) break;
      supers = cdr(supers);
    }
  }

  /* we didn't find it at all; return NIL */
  return NIL_PTR;
}